

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

char * gl4cts::TextureViewUtilities::getTextureTargetString(GLenum texture_target)

{
  char *local_18;
  char *result;
  GLenum texture_target_local;
  
  local_18 = "[?]";
  if (texture_target == 0xde0) {
    local_18 = "GL_TEXTURE_1D";
  }
  else if (texture_target == 0xde1) {
    local_18 = "GL_TEXTURE_2D";
  }
  else if (texture_target == 0x806f) {
    local_18 = "GL_TEXTURE_3D";
  }
  else if (texture_target == 0x84f5) {
    local_18 = "GL_TEXTURE_RECTANGLE";
  }
  else if (texture_target == 0x8513) {
    local_18 = "GL_TEXTURE_CUBE_MAP";
  }
  else if (texture_target == 0x8c18) {
    local_18 = "GL_TEXTURE_1D_ARRAY";
  }
  else if (texture_target == 0x8c1a) {
    local_18 = "GL_TEXTURE_2D_ARRAY";
  }
  else if (texture_target == 0x8c2a) {
    local_18 = "GL_TEXTURE_BUFFER";
  }
  else if (texture_target == 0x9009) {
    local_18 = "GL_TEXTURE_CUBE_MAP_ARRAY";
  }
  else if (texture_target == 0x9100) {
    local_18 = "GL_TEXTURE_2D_MULTISAMPLE";
  }
  else if (texture_target == 0x9102) {
    local_18 = "GL_TEXTURE_2D_MULTISAMPLE_ARRAY";
  }
  return local_18;
}

Assistant:

const char* TextureViewUtilities::getTextureTargetString(const glw::GLenum texture_target)
{
	const char* result = "[?]";

	switch (texture_target)
	{
	case GL_TEXTURE_1D:
		result = "GL_TEXTURE_1D";
		break;
	case GL_TEXTURE_1D_ARRAY:
		result = "GL_TEXTURE_1D_ARRAY";
		break;
	case GL_TEXTURE_2D:
		result = "GL_TEXTURE_2D";
		break;
	case GL_TEXTURE_2D_ARRAY:
		result = "GL_TEXTURE_2D_ARRAY";
		break;
	case GL_TEXTURE_2D_MULTISAMPLE:
		result = "GL_TEXTURE_2D_MULTISAMPLE";
		break;
	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		result = "GL_TEXTURE_2D_MULTISAMPLE_ARRAY";
		break;
	case GL_TEXTURE_3D:
		result = "GL_TEXTURE_3D";
		break;
	case GL_TEXTURE_BUFFER:
		result = "GL_TEXTURE_BUFFER";
		break;
	case GL_TEXTURE_CUBE_MAP:
		result = "GL_TEXTURE_CUBE_MAP";
		break;
	case GL_TEXTURE_CUBE_MAP_ARRAY:
		result = "GL_TEXTURE_CUBE_MAP_ARRAY";
		break;
	case GL_TEXTURE_RECTANGLE:
		result = "GL_TEXTURE_RECTANGLE";
		break;
	}

	return result;
}